

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

ExpressionSpec *
rsg::anon_unknown_0::chooseExpression
          (GeneratorState *state,ExpressionSpec *specs,int numSpecs,ConstValueRangeAccess valueRange
          )

{
  Random *this;
  ExpressionSpec *pEVar1;
  float fVar2;
  int local_9c;
  float local_98;
  int ndx;
  float weights [30];
  int numSpecs_local;
  ExpressionSpec *specs_local;
  GeneratorState *state_local;
  
  weights[0x1d] = (float)numSpecs;
  for (local_9c = 0; local_9c < (int)weights[0x1d]; local_9c = local_9c + 1) {
    fVar2 = (*specs[local_9c].getWeight)(state,valueRange);
    (&local_98)[local_9c] = fVar2;
  }
  this = GeneratorState::getRandom(state);
  pEVar1 = de::Random::
           chooseWeighted<rsg::(anonymous_namespace)::ExpressionSpec_const&,rsg::(anonymous_namespace)::ExpressionSpec_const*,float*>
                     (this,specs,specs + (int)weights[0x1d],&local_98);
  return pEVar1;
}

Assistant:

const ExpressionSpec* chooseExpression (GeneratorState& state, const ExpressionSpec* specs, int numSpecs, ConstValueRangeAccess valueRange)
{
	float weights[MAX_EXPRESSION_SPECS];

	DE_ASSERT(numSpecs <= (int)DE_LENGTH_OF_ARRAY(weights));

	// Compute weights
	for (int ndx = 0; ndx < numSpecs; ndx++)
		weights[ndx] = specs[ndx].getWeight(state, valueRange);

	// Choose
	return &state.getRandom().chooseWeighted<const ExpressionSpec&>(specs, specs+numSpecs, weights);
}